

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalResumeThread
                    (CPalThread *pthrResumer,HANDLE hTargetThread,DWORD *pdwSuspendCount)

{
  PAL_ERROR PVar1;
  CPalThread *local_30;
  CPalThread *pthrTarget;
  IPalObject *pobjThread;
  
  local_30 = (CPalThread *)0x0;
  pthrTarget = (CPalThread *)0x0;
  PVar1 = InternalGetThreadDataFromHandle
                    (pthrResumer,hTargetThread,0,&local_30,(IPalObject **)&pthrTarget);
  if (PVar1 == 0) {
    PVar1 = CThreadSuspensionInfo::InternalResumeThreadFromData
                      (&pthrResumer->suspensionInfo,pthrResumer,local_30,pdwSuspendCount);
  }
  if (pthrTarget != (CPalThread *)0x0) {
    (*pthrTarget->_vptr_CPalThread[8])(pthrTarget,pthrResumer);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalResumeThread(
    CPalThread *pthrResumer,
    HANDLE hTargetThread,
    DWORD *pdwSuspendCount
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthrTarget = NULL;
    IPalObject *pobjThread = NULL;

    palError = InternalGetThreadDataFromHandle(
        pthrResumer,
        hTargetThread,
        0, // THREAD_SUSPEND_RESUME
        &pthrTarget,
        &pobjThread
        );

    if (NO_ERROR == palError)
    {
        palError = pthrResumer->suspensionInfo.InternalResumeThreadFromData(
            pthrResumer,
            pthrTarget,
            pdwSuspendCount
            );
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pthrResumer);
    }

    return palError;
}